

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondOrderParameter.cpp
# Opt level: O0

void __thiscall
OpenMD::BondOrderParameter::collectHistogram
          (BondOrderParameter *this,vector<double,_std::allocator<double>_> *q,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *what)

{
  reference pvVar1;
  mapped_type *pmVar2;
  reference pvVar3;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double dVar4;
  int wbin;
  int l_1;
  int qbin;
  int l;
  int *in_stack_ffffffffffffff98;
  int local_2c;
  pair<int,_int> in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int iVar5;
  
  for (iVar5 = 0; iVar5 < 0xd; iVar5 = iVar5 + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar5);
    if (*pvVar1 < *(double *)(in_RDI + 0x7a8)) {
LAB_0013f737:
      snprintf(painCave.errMsg,2000,"q_l value outside reasonable range\n");
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
    else {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar5);
      if (*(double *)(in_RDI + 0x7b0) <= *pvVar1) goto LAB_0013f737;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar5);
      in_stack_ffffffffffffffe0 =
           (int)((*pvVar1 - *(double *)(in_RDI + 0x7a8)) / *(double *)(in_RDI + 0x7b8));
      in_stack_ffffffffffffffd8 =
           std::make_pair<int&,int&>(in_stack_ffffffffffffff98,(int *)0x13f6fd);
      pmVar2 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                             *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                            (key_type *)in_stack_ffffffffffffffd8);
      *pmVar2 = *pmVar2 + 1;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x7c0),(long)iVar5);
      *pvVar3 = *pvVar3 + 1;
    }
  }
  local_2c = 0;
  do {
    if (0xc < local_2c) {
      return;
    }
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
              (in_RDX,(long)local_2c);
    dVar4 = std::real<double>((complex<double> *)0x13f7b4);
    if (dVar4 < *(double *)(in_RDI + 0x808)) {
LAB_0013f880:
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                (in_RDX,(long)local_2c);
      std::real<double>((complex<double> *)0x13f897);
      snprintf(painCave.errMsg,2000,"Re[w_hat] value (%lf) outside reasonable range\n");
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
    else {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                (in_RDX,(long)local_2c);
      dVar4 = std::real<double>((complex<double> *)0x13f7de);
      if (*(double *)(in_RDI + 0x810) <= dVar4) goto LAB_0013f880;
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                (in_RDX,(long)local_2c);
      std::real<double>((complex<double> *)0x13f80f);
      std::make_pair<int&,int&>(in_stack_ffffffffffffff98,(int *)0x13f846);
      pmVar2 = std::
               map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
               ::operator[]((map<std::pair<int,_int>,_int,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_int>_>_>
                             *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),
                            (key_type *)in_stack_ffffffffffffffd8);
      *pmVar2 = *pmVar2 + 1;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x820),(long)local_2c);
      *pvVar3 = *pvVar3 + 1;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

void BondOrderParameter::collectHistogram(std::vector<RealType> q,
                                            std::vector<ComplexType> what) {
    for (int l = 0; l <= lMax_; l++) {
      if (q[l] >= MinQ_ && q[l] < MaxQ_) {
        int qbin = int((q[l] - MinQ_) / deltaQ_);
        Q_histogram_[std::make_pair(qbin, l)] += 1;
        Qcount_[l]++;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "q_l value outside reasonable range\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }

    for (int l = 0; l <= lMax_; l++) {
      if (real(what[l]) >= MinW_ && real(what[l]) < MaxW_) {
        int wbin = int((real(what[l]) - MinW_) / deltaW_);
        W_histogram_[std::make_pair(wbin, l)] += 1;
        Wcount_[l]++;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Re[w_hat] value (%lf) outside reasonable range\n",
                 real(what[l]));
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }
  }